

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SGP4.cc
# Opt level: O3

void libsgp4::SGP4::RecomputeConstants
               (double xinc,double *sinio,double *cosio,double *x3thm1,double *x1mth2,double *x7thm1
               ,double *xlcof,double *aycof)

{
  ulong uVar1;
  double dVar2;
  
  dVar2 = sin(xinc);
  *sinio = dVar2;
  dVar2 = cos(xinc);
  *cosio = dVar2;
  dVar2 = dVar2 * dVar2;
  *x3thm1 = dVar2 * 3.0 + -1.0;
  *x1mth2 = 1.0 - dVar2;
  *x7thm1 = dVar2 * 7.0 + -1.0;
  dVar2 = *cosio + 1.0;
  uVar1 = -(ulong)(1.5e-12 < ABS(dVar2));
  *xlcof = ((*cosio * 5.0 + 3.0) * *sinio * 0.000586267430002882) /
           (double)(~uVar1 & 0x3d7a636641c4df1a | (ulong)dVar2 & uVar1);
  *aycof = *sinio * 0.001172534860005764;
  return;
}

Assistant:

void SGP4::RecomputeConstants(const double xinc,
                              double& sinio,
                              double& cosio,
                              double& x3thm1,
                              double& x1mth2,
                              double& x7thm1,
                              double& xlcof,
                              double& aycof)
{
    sinio = sin(xinc);
    cosio = cos(xinc);

    const double theta2 = cosio * cosio;

    x3thm1 = 3.0 * theta2 - 1.0;
    x1mth2 = 1.0 - theta2;
    x7thm1 = 7.0 * theta2 - 1.0;

    if (fabs(cosio + 1.0) > 1.5e-12)
    {
        xlcof = 0.125 * kA3OVK2 * sinio * (3.0 + 5.0 * cosio) / (1.0 + cosio);
    }
    else
    {
        xlcof = 0.125 * kA3OVK2 * sinio * (3.0 + 5.0 * cosio) / 1.5e-12;
    }

    aycof = 0.25 * kA3OVK2 * sinio;
}